

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *lhs;
  int vert_start_idx_00;
  int vert_end_idx_00;
  ImDrawList *this;
  bool bVar1;
  ImGuiContext_conflict *pIVar2;
  bool bVar3;
  _Bool _Var4;
  bool bVar5;
  ImU32 IVar6;
  int iVar7;
  uint col_upr_left;
  uint col_00;
  ImU32 IVar8;
  ImU32 col_01;
  ImGuiWindow *pIVar9;
  ImGuiStyle *pIVar10;
  float fVar11;
  float _x;
  float fVar12;
  float _x_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_4c0;
  float local_42c;
  float local_410;
  float local_408;
  byte local_3f9;
  float local_3f8;
  float local_3f0;
  float local_3dc;
  byte local_399;
  uint local_398;
  uint local_394;
  ImVec2 local_390;
  ImVec2 local_388;
  ImVec2 local_380;
  ImVec2 local_378;
  float local_36c;
  ImVec2 IStack_368;
  float bar1_line_y;
  ImVec2 local_360;
  ImVec2 local_358;
  undefined1 local_350 [8];
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  ImVec2 local_330;
  ImVec2 local_328;
  ImVec2 local_320;
  float local_318;
  float bar0_line_y;
  ImVec2 local_30c;
  int local_304;
  int i;
  ImVec2 local_2f8;
  ImVec2 local_2f0;
  ImVec2 local_2e8;
  ImVec2 local_2e0;
  ImVec2 local_2d8;
  ImVec2 local_2d0;
  ImVec2 local_2c8;
  ImVec2 local_2c0;
  ImVec2 local_2b8;
  ImVec2 uv_white;
  ImVec2 local_2a8;
  ImVec2 trc;
  ImVec2 local_298;
  ImVec2 trb;
  ImVec2 local_288;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 local_254;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 user_col32_striped_of_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  ImU32 col_hues [7];
  ImU32 col_midgrey;
  ImU32 col_white;
  ImU32 col_black;
  int style_alpha8;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward_1;
  bool value_changed_fix_hue_wrap;
  ImVec2 local_1a4;
  undefined1 local_19c [8];
  ImVec4 ref_col_v4;
  undefined1 local_180 [4];
  ImGuiColorEditFlags sub_flags_to_forward;
  ImVec4 col_v4;
  char *label_display_end;
  ImVec2 local_15c;
  ImVec2 local_154;
  ImVec2 local_14c;
  ImVec4 local_144;
  ImVec2 local_134;
  float local_12c;
  float local_128;
  float ww;
  float vv;
  float uu;
  ImVec2 local_118;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  _Bool local_e2;
  float local_e0;
  bool value_changed_sv;
  bool value_changed_h;
  float fStack_dc;
  bool value_changed;
  float B;
  float G;
  float R;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  float width;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *ref_col_local;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar2 = GImGui;
  pIVar9 = GetCurrentWindow();
  if ((pIVar9->SkipItems & 1U) != 0) {
    return false;
  }
  this = pIVar9->DrawList;
  pIVar10 = &pIVar2->Style;
  fVar11 = CalcItemWidth();
  ImGuiNextItemData::ClearFlags(&pIVar2->NextItemData);
  PushID(label);
  BeginGroup();
  ref_col_local._4_4_ = flags;
  if ((flags & 0x100U) == 0) {
    ref_col_local._4_4_ = flags | 0x10;
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ColorPickerOptionsPopup(col,ref_col_local._4_4_);
  }
  if ((ref_col_local._4_4_ & 0x6000000) == 0) {
    if ((pIVar2->ColorEditOptions & 0x6000000U) == 0) {
      local_394 = 0xa900000;
    }
    else {
      local_394 = pIVar2->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_394 & 0x6000000 | ref_col_local._4_4_;
  }
  if ((ref_col_local._4_4_ & 0x18000000) == 0) {
    if ((pIVar2->ColorEditOptions & 0x18000000U) == 0) {
      local_398 = 0xa900000;
    }
    else {
      local_398 = pIVar2->ColorEditOptions;
    }
    ref_col_local._4_4_ = local_398 & 0x18000000 | ref_col_local._4_4_;
  }
  bVar3 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x6000000);
  if (!bVar3) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f7,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  bVar3 = ImIsPowerOfTwo(ref_col_local._4_4_ & 0x18000000);
  if (!bVar3) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f8,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((ref_col_local._4_4_ & 8) == 0) {
    ref_col_local._4_4_ = pIVar2->ColorEditOptions & 0x10000U | ref_col_local._4_4_;
  }
  picker_pos.y = 5.60519e-45;
  if ((ref_col_local._4_4_ & 2) != 0) {
    picker_pos.y = 4.2039e-45;
  }
  local_399 = 0;
  if ((ref_col_local._4_4_ & 0x10000) != 0) {
    local_399 = (ref_col_local._4_4_ & 2) != 0 ^ 0xff;
  }
  picker_pos.x._3_1_ = local_399 & 1;
  _bars_width = (pIVar9->DC).CursorPos;
  _x = GetFrameHeight();
  iVar7 = 1;
  if ((picker_pos.x._3_1_ & 1) != 0) {
    iVar7 = 2;
  }
  fVar11 = ImMax<float>(_x * 1.0,-(float)iVar7 * (_x + (pIVar2->Style).ItemInnerSpacing.x) + fVar11)
  ;
  fVar12 = bars_width + fVar11 + (pIVar2->Style).ItemInnerSpacing.x;
  _x_00 = fVar12 + _x + (pIVar2->Style).ItemInnerSpacing.x;
  backup_initial_col[3] = (float)(int)(_x * 0.2);
  memcpy(&wheel_r_outer,col,(long)(int)picker_pos.y << 2);
  local_42c = fVar11 * 0.08;
  fVar13 = fVar11 * 0.5;
  fVar14 = fVar13 - local_42c;
  ImVec2::ImVec2((ImVec2 *)&triangle_pa.y,(fVar11 + _x) * 0.5 + bars_width,fVar11 * 0.5 + square_sz)
  ;
  triangle_pa.x = fVar14 - (float)(int)(fVar11 * 0.027);
  ImVec2::ImVec2(&triangle_pb,triangle_pa.x,0.0);
  ImVec2::ImVec2(&triangle_pc,triangle_pa.x * -0.5,triangle_pa.x * -0.866025);
  ImVec2::ImVec2((ImVec2 *)&S,triangle_pa.x * -0.5,triangle_pa.x * 0.866025);
  V = *col;
  R = col[1];
  G = col[2];
  B = *col;
  fStack_dc = col[1];
  local_e0 = col[2];
  if ((ref_col_local._4_4_ & 0x8000000) == 0) {
    if ((ref_col_local._4_4_ & 0x10000000) != 0) {
      ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
    }
  }
  else {
    ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
    ColorEditRestoreHS(col,&V,&R,&G);
  }
  bVar3 = false;
  local_e2 = false;
  bVar1 = false;
  PushItemFlag(8,true);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_134,fVar11,fVar11);
      InvisibleButton("sv",&local_134,0);
      _Var4 = IsItemActive();
      if (_Var4) {
        R = ImSaturate(((pIVar2->IO).MousePos.x - bars_width) / (fVar11 - 1.0));
        fVar15 = ImSaturate(((pIVar2->IO).MousePos.y - square_sz) / (fVar11 - 1.0));
        G = 1.0 - fVar15;
        IVar6 = pIVar2->ColorEditLastColor;
        ImVec4::ImVec4(&local_144,*col,col[1],col[2],0.0);
        IVar8 = ColorConvertFloat4ToU32(&local_144);
        if (IVar6 == IVar8) {
          V = pIVar2->ColorEditLastHue;
        }
        bVar1 = true;
        bVar3 = true;
      }
      if ((ref_col_local._4_4_ & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      ImVec2::ImVec2(&local_14c,fVar12,square_sz);
      SetCursorScreenPos(&local_14c);
      ImVec2::ImVec2(&local_154,_x,fVar11);
      InvisibleButton("hue",&local_154,0);
      local_e2 = IsItemActive();
      if (local_e2) {
        V = ImSaturate(((pIVar2->IO).MousePos.y - square_sz) / (fVar11 - 1.0));
        bVar3 = true;
      }
    }
  }
  else {
    ImVec2::ImVec2(&initial_off,fVar11 + (pIVar2->Style).ItemInnerSpacing.x + _x,fVar11);
    InvisibleButton("hsv",&initial_off,0);
    _Var4 = IsItemActive();
    if (_Var4) {
      current_off = operator-((pIVar2->IO).MouseClickedPos,(ImVec2 *)&triangle_pa.y);
      _cos_hue_angle = operator-(&(pIVar2->IO).MousePos,(ImVec2 *)&triangle_pa.y);
      fVar15 = ImLengthSqr(&current_off);
      if (((fVar14 - 1.0) * (fVar14 - 1.0) <= fVar15) && (fVar15 <= (fVar13 + 1.0) * (fVar13 + 1.0))
         ) {
        fVar15 = atan2f(initial_dist2,cos_hue_angle);
        V = (fVar15 / 3.1415927) * 0.5;
        if (V < 0.0) {
          V = V + 1.0;
        }
        local_e2 = true;
        bVar3 = true;
      }
      fVar15 = cosf((-V - V) * 3.1415927);
      fVar16 = sinf((-V - V) * 3.1415927);
      current_off_unrotated = ImRotate(&current_off,fVar15,fVar16);
      _Var4 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&current_off_unrotated)
      ;
      if (_Var4) {
        local_118 = ImRotate((ImVec2 *)&cos_hue_angle,fVar15,fVar16);
        _Var4 = ImTriangleContainsPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
        if (!_Var4) {
          _vv = ImTriangleClosestPoint(&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118);
          local_118 = _vv;
        }
        ImTriangleBarycentricCoords
                  (&triangle_pb,&triangle_pc,(ImVec2 *)&S,&local_118,&ww,&local_128,&local_12c);
        G = ImClamp<float>(1.0 - local_128,0.0001,1.0);
        R = ImClamp<float>(ww / G,0.0001,1.0);
        bVar1 = true;
        bVar3 = true;
      }
    }
    if ((ref_col_local._4_4_ & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  if ((picker_pos.x._3_1_ & 1) != 0) {
    ImVec2::ImVec2(&local_15c,_x_00,square_sz);
    SetCursorScreenPos(&local_15c);
    ImVec2::ImVec2((ImVec2 *)((long)&label_display_end + 4),_x,fVar11);
    InvisibleButton("alpha",(ImVec2 *)((long)&label_display_end + 4),0);
    _Var4 = IsItemActive();
    if (_Var4) {
      fVar15 = ImSaturate(((pIVar2->IO).MousePos.y - square_sz) / (fVar11 - 1.0));
      col[3] = 1.0 - fVar15;
      bVar3 = true;
    }
  }
  PopItemFlag();
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (((ref_col_local._4_4_ & 0x80) == 0) &&
     (col_v4._8_8_ = FindRenderedTextEnd(label,(char *)0x0), label != (char *)col_v4._8_8_)) {
    if ((ref_col_local._4_4_ & 0x100) != 0) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    }
    TextEx(label,(char *)col_v4._8_8_,0);
  }
  if ((ref_col_local._4_4_ & 0x100) == 0) {
    PushItemFlag(0x10,true);
    if ((ref_col_local._4_4_ & 2) == 0) {
      local_3dc = col[3];
    }
    else {
      local_3dc = 1.0;
    }
    ImVec4::ImVec4((ImVec4 *)local_180,*col,col[1],col[2],local_3dc);
    if ((ref_col_local._4_4_ & 0x80) != 0) {
      Text("Current");
    }
    ImVec2::ImVec2((ImVec2 *)&ref_col_v4.z,_x * 3.0,_x + _x);
    ColorButton("##current",(ImVec4 *)local_180,ref_col_local._4_4_ & 0x180e0040,
                (ImVec2)ref_col_v4._8_8_);
    if (ref_col != (float *)0x0) {
      Text("Original");
      if ((ref_col_local._4_4_ & 2) == 0) {
        local_3f0 = ref_col[3];
      }
      else {
        local_3f0 = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)local_19c,*ref_col,ref_col[1],ref_col[2],local_3f0);
      ImVec2::ImVec2(&local_1a4,_x * 3.0,_x + _x);
      bVar5 = ColorButton("##original",(ImVec4 *)local_19c,ref_col_local._4_4_ & 0x180e0040,
                          local_1a4);
      if (bVar5) {
        memcpy(col,ref_col,(long)(int)picker_pos.y << 2);
        bVar3 = true;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if ((local_e2 != false) || (bVar1)) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        *col = V;
        col[1] = R;
        col[2] = G;
      }
    }
    else {
      ColorConvertHSVtoRGB(V,R,G,col,col + 1,col + 2);
      pIVar2->ColorEditLastHue = V;
      pIVar2->ColorEditLastSat = R;
      ImVec4::ImVec4((ImVec4 *)&sub_flags_to_forward_1,*col,col[1],col[2],0.0);
      IVar6 = ColorConvertFloat4ToU32((ImVec4 *)&sub_flags_to_forward_1);
      pIVar2->ColorEditLastColor = IVar6;
    }
  }
  sub_flags._3_1_ = 0;
  if ((ref_col_local._4_4_ & 0x20) == 0) {
    local_3f8 = fVar12;
    if ((picker_pos.x._3_1_ & 1) != 0) {
      local_3f8 = _x_00;
    }
    PushItemWidth((local_3f8 + _x) - bars_width);
    new_H = 1.4682497e-23;
    new_S = (float)(ref_col_local._4_4_ & 0x198e001a | 4);
    if ((((ref_col_local._4_4_ & 0x100000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) &&
       (bVar5 = ColorEdit4("##rgb",col,ref_col_local._4_4_ & 0x198e001a | 0x100004), bVar5)) {
      local_3f9 = 0;
      if (pIVar2->ActiveId != 0) {
        local_3f9 = pIVar2->ActiveIdAllowOverlap ^ 0xff;
      }
      sub_flags._3_1_ = local_3f9 & 1;
      bVar3 = true;
    }
    if (((ref_col_local._4_4_ & 0x200000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar5 = ColorEdit4("##hsv",col,(uint)new_S | 0x200000);
      bVar3 = bVar3 != false || bVar5;
    }
    if (((ref_col_local._4_4_ & 0x400000) != 0) || ((ref_col_local._4_4_ & 0x700000) == 0)) {
      bVar5 = ColorEdit4("##hex",col,(uint)new_S | 0x400000);
      bVar3 = bVar3 != false || bVar5;
    }
    PopItemWidth();
  }
  if (((((sub_flags._3_1_ & 1) != 0) && ((ref_col_local._4_4_ & 0x8000000) != 0)) &&
      (ColorConvertRGBtoHSV(*col,col[1],col[2],&new_V,(float *)&style_alpha8,(float *)&col_black),
      new_V <= 0.0)) && (0.0 < V)) {
    if ((float)col_black <= 0.0) {
      if ((G != (float)col_black) || (NAN(G) || NAN((float)col_black))) {
        if (0.0 < (float)col_black) {
          local_408 = (float)col_black;
        }
        else {
          local_408 = G * 0.5;
        }
        ColorConvertHSVtoRGB(V,R,local_408,col,col + 1,col + 2);
        goto LAB_002eae6f;
      }
    }
    if ((float)style_alpha8 <= 0.0) {
      if (0.0 < (float)style_alpha8) {
        local_410 = (float)style_alpha8;
      }
      else {
        local_410 = R * 0.5;
      }
      ColorConvertHSVtoRGB(V,local_410,(float)col_black,col,col + 1,col + 2);
    }
  }
LAB_002eae6f:
  if (bVar3 != false) {
    if ((ref_col_local._4_4_ & 0x8000000) == 0) {
      if ((ref_col_local._4_4_ & 0x10000000) != 0) {
        V = *col;
        R = col[1];
        G = col[2];
        ColorConvertHSVtoRGB(V,R,G,&B,&stack0xffffffffffffff24,&local_e0);
      }
    }
    else {
      B = *col;
      fStack_dc = col[1];
      local_e0 = col[2];
      ColorConvertRGBtoHSV(B,fStack_dc,local_e0,&V,&R,&G);
      ColorEditRestoreHS(col,&V,&R,&G);
    }
  }
  fVar15 = ImSaturate(pIVar10->Alpha);
  iVar7 = (int)(fVar15 * 255.0 + 0.5);
  IVar6 = iVar7 << 0x18;
  col_upr_left = iVar7 << 0x18 | 0xffffff;
  col_00 = iVar7 << 0x18 | 0x808080;
  hue_color_f.z = (float)(iVar7 << 0x18 | 0xff);
  hue_color_f.w = (float)(iVar7 << 0x18 | 0xffff);
  ImVec4::ImVec4((ImVec4 *)&user_col32_striped_of_alpha,1.0,1.0,1.0,pIVar10->Alpha);
  ColorConvertHSVtoRGB
            (V,1.0,1.0,(float *)&user_col32_striped_of_alpha,(float *)&hue_color32,&hue_color_f.x);
  IVar8 = ColorConvertFloat4ToU32((ImVec4 *)&user_col32_striped_of_alpha);
  ImVec4::ImVec4((ImVec4 *)&sv_cursor_pos,B,fStack_dc,local_e0,pIVar10->Alpha);
  col_01 = ColorConvertFloat4ToU32((ImVec4 *)&sv_cursor_pos);
  ImVec2::ImVec2((ImVec2 *)&segment_per_arc);
  if ((ref_col_local._4_4_ & 0x4000000) == 0) {
    if ((ref_col_local._4_4_ & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_2d8,fVar11,fVar11);
      local_2d0 = operator+((ImVec2 *)&bars_width,&local_2d8);
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)&bars_width,&local_2d0,col_upr_left,IVar8,IVar8,
                 iVar7 << 0x18 | 0xffffff);
      ImVec2::ImVec2(&local_2e8,fVar11,fVar11);
      local_2e0 = operator+((ImVec2 *)&bars_width,&local_2e8);
      ImDrawList::AddRectFilledMultiColor(this,(ImVec2 *)&bars_width,&local_2e0,0,0,IVar6,IVar6);
      local_2f0 = _bars_width;
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd00,fVar11,fVar11);
      local_2f8 = operator+((ImVec2 *)&bars_width,(ImVec2 *)&stack0xfffffffffffffd00);
      RenderFrameBorder(local_2f0,local_2f8,0.0);
      fVar13 = bars_width;
      fVar14 = ImSaturate(R);
      segment_per_arc =
           (int)ImClamp<float>((float)(int)(fVar14 * fVar11 + fVar13 + 0.5),bars_width + 2.0,
                               (bars_width + fVar11) - 2.0);
      fVar13 = square_sz;
      fVar14 = ImSaturate(1.0 - G);
      fVar13 = ImClamp<float>((float)(int)(fVar14 * fVar11 + fVar13 + 0.5),square_sz + 2.0,
                              (square_sz + fVar11) - 2.0);
      aeps = fVar13;
      for (local_304 = 0; local_304 < 6; local_304 = local_304 + 1) {
        ImVec2::ImVec2(&local_30c,fVar12,(float)local_304 * (fVar11 / 6.0) + square_sz);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffcec,fVar12 + _x,
                       (float)(local_304 + 1) * (fVar11 / 6.0) + square_sz);
        ImDrawList::AddRectFilledMultiColor
                  (this,&local_30c,(ImVec2 *)&stack0xfffffffffffffcec,col_hues[(long)local_304 + -2]
                   ,col_hues[(long)local_304 + -2],col_hues[(long)(local_304 + 1) + -2],
                   col_hues[(long)(local_304 + 1) + -2]);
      }
      local_318 = (float)(int)(V * fVar11 + square_sz + 0.5);
      ImVec2::ImVec2(&local_320,fVar12,square_sz);
      ImVec2::ImVec2(&local_328,fVar12 + _x,square_sz + fVar11);
      RenderFrameBorder(local_320,local_328,0.0);
      ImVec2::ImVec2(&local_330,fVar12 - 1.0,local_318);
      ImVec2::ImVec2((ImVec2 *)&alpha,backup_initial_col[3] + 1.0,backup_initial_col[3]);
      RenderArrowsForVerticalBar(this,local_330,_alpha,_x + 2.0,pIVar10->Alpha);
    }
  }
  else {
    iVar7 = ImMax<int>(4,(int)fVar13 / 0xc);
    for (a1 = 0.0; (int)a1 < 6; a1 = (float)((int)a1 + 1)) {
      fVar15 = ((float)(int)a1 / 6.0 + (float)(int)a1 / 6.0) * 3.1415927 - 0.5 / fVar13;
      fVar12 = ((float)(int)a1 + 1.0) / 6.0;
      fVar16 = (fVar12 + fVar12) * 3.1415927 + 0.5 / fVar13;
      vert_start_idx_00 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo
                (this,(ImVec2 *)&triangle_pa.y,(fVar14 + fVar13) * 0.5,fVar15,fVar16,iVar7);
      ImDrawList::PathStroke(this,col_upr_left,0,local_42c);
      fVar12 = triangle_pa.y;
      vert_end_idx_00 = (this->VtxBuffer).Size;
      fVar17 = cosf(fVar15);
      fVar15 = sinf(fVar15);
      ImVec2::ImVec2(&gradient_p1,fVar17 * fVar14 + fVar12,fVar15 * fVar14 + triangle_r);
      fVar12 = triangle_pa.y;
      fVar15 = cosf(fVar16);
      fVar16 = sinf(fVar16);
      ImVec2::ImVec2(&local_254,fVar15 * fVar14 + fVar12,fVar16 * fVar14 + triangle_r);
      ShadeVertsLinearColorGradientKeepAlpha
                (this,vert_start_idx_00,vert_end_idx_00,gradient_p1,local_254,
                 col_hues[(long)(int)a1 + -2],col_hues[(long)(int)a1 + -1]);
    }
    hue_cursor_pos.y = cosf(V * 2.0 * 3.1415927);
    hue_cursor_pos.x = sinf(V * 2.0 * 3.1415927);
    ImVec2::ImVec2((ImVec2 *)&hue_cursor_segments,
                   hue_cursor_pos.y * (fVar14 + fVar13) * 0.5 + triangle_pa.y,
                   hue_cursor_pos.x * (fVar14 + fVar13) * 0.5 + triangle_r);
    if (local_e2 == false) {
      local_42c = local_42c * 0.55;
    }
    else {
      local_42c = local_42c * 0.65;
    }
    tra.y = local_42c;
    tra.x = (float)ImClamp<int>((int)(local_42c / 1.4),9,0x20);
    ImDrawList::AddCircleFilled(this,(ImVec2 *)&hue_cursor_segments,tra.y,IVar8,(int)tra.x);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y + 1.0,col_00,(int)tra.x,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)&hue_cursor_segments,tra.y,col_upr_left,(int)tra.x,1.0);
    trb = ImRotate(&triangle_pb,hue_cursor_pos.y,hue_cursor_pos.x);
    lhs = &triangle_pa.y;
    local_288 = operator+((ImVec2 *)lhs,&trb);
    trc = ImRotate(&triangle_pc,hue_cursor_pos.y,hue_cursor_pos.x);
    local_298 = operator+((ImVec2 *)lhs,&trc);
    uv_white = ImRotate((ImVec2 *)&S,hue_cursor_pos.y,hue_cursor_pos.x);
    local_2a8 = operator+((ImVec2 *)lhs,&uv_white);
    local_2b8 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(this,6,6);
    ImDrawList::PrimVtx(this,&local_288,&local_2b8,IVar8);
    ImDrawList::PrimVtx(this,&local_298,&local_2b8,IVar8);
    ImDrawList::PrimVtx(this,&local_2a8,&local_2b8,col_upr_left);
    ImDrawList::PrimVtx(this,&local_288,&local_2b8,0);
    ImDrawList::PrimVtx(this,&local_298,&local_2b8,IVar6);
    ImDrawList::PrimVtx(this,&local_2a8,&local_2b8,0);
    ImDrawList::AddTriangle(this,&local_288,&local_298,&local_2a8,col_00,1.5);
    fVar12 = ImSaturate(R);
    local_2c8 = ImLerp(&local_2a8,&local_288,fVar12);
    fVar12 = ImSaturate(1.0 - G);
    local_2c0 = ImLerp(&local_2c8,&local_298,fVar12);
    _segment_per_arc = local_2c0;
  }
  local_4c0 = 10.0;
  if (!bVar1) {
    local_4c0 = 6.0;
  }
  bar1_bb.Max.y = local_4c0;
  ImDrawList::AddCircleFilled(this,(ImVec2 *)&segment_per_arc,local_4c0,col_01,0xc);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y + 1.0,col_00,0xc,1.0);
  ImDrawList::AddCircle(this,(ImVec2 *)&segment_per_arc,bar1_bb.Max.y,col_upr_left,0xc,1.0);
  if ((picker_pos.x._3_1_ & 1) != 0) {
    bar1_bb.Max.x = ImSaturate(col[3]);
    ImRect::ImRect((ImRect *)local_350,_x_00,square_sz,_x_00 + _x,square_sz + fVar11);
    local_358.x = (float)local_350._0_4_;
    local_358.y = (float)local_350._4_4_;
    local_360 = bar1_bb.Min;
    fVar12 = ImRect::GetWidth((ImRect *)local_350);
    ImVec2::ImVec2(&stack0xfffffffffffffc98,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard(this,local_358,local_360,0,fVar12 * 0.5,IStack_368,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_350,&bar1_bb.Min,col_01,col_01,col_01 & 0xffffff,
               col_01 & 0xffffff);
    local_36c = (float)(int)((1.0 - bar1_bb.Max.x) * fVar11 + square_sz + 0.5);
    local_378.x = (float)local_350._0_4_;
    local_378.y = (float)local_350._4_4_;
    local_380 = bar1_bb.Min;
    RenderFrameBorder((ImVec2)local_350,bar1_bb.Min,0.0);
    ImVec2::ImVec2(&local_388,_x_00 - 1.0,local_36c);
    ImVec2::ImVec2(&local_390,backup_initial_col[3] + 1.0,backup_initial_col[3]);
    RenderArrowsForVerticalBar(this,local_388,local_390,_x + 2.0,pIVar10->Alpha);
  }
  EndGroup();
  if ((bVar3 != false) &&
     (iVar7 = memcmp(&wheel_r_outer,col,(long)(int)picker_pos.y << 2), iVar7 == 0)) {
    bVar3 = false;
  }
  if (bVar3 != false) {
    MarkItemEdited((pIVar2->LastItemData).ID);
  }
  PopID();
  return bVar3;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}